

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hh
# Opt level: O1

cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
* __thiscall
tchecker::
cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
::operator++(cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
             *this)

{
  pointer peVar1;
  size_t sVar2;
  shared_ptr<tchecker::system::edge_t> *psVar3;
  
  sVar2 = this->_nranges;
  if ((sVar2 != 0) &&
     ((((this->_its).
        super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
        ._M_impl.super__Vector_impl_data._M_start)->super_const_iterator)._M_current !=
      (((this->_ends).
        super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
        ._M_impl.super__Vector_impl_data._M_start)->super_const_iterator)._M_current)) {
    if (-1 < (long)(sVar2 - 1)) {
      do {
        peVar1 = (this->_its).
                 super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar3 = peVar1[sVar2 - 1].super_const_iterator._M_current + 1;
        peVar1[sVar2 - 1].super_const_iterator._M_current = psVar3;
        if (psVar3 != (this->_ends).
                      super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
                      ._M_impl.super__Vector_impl_data._M_start[sVar2 - 1].super_const_iterator.
                      _M_current) {
          return this;
        }
        if (sVar2 != 1) {
          peVar1[sVar2 - 1].super_const_iterator._M_current =
               (this->_begins).
               super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar2 - 1].super_const_iterator._M_current;
        }
        sVar2 = sVar2 - 1;
      } while (0 < (long)sVar2);
    }
    return this;
  }
  __assert_fail("!at_end()",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/iterator.hh"
                ,0x29a,
                "tchecker::cartesian_iterator_t<R> &tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>>::operator++() [R = tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>]"
               );
}

Assistant:

tchecker::cartesian_iterator_t<R> & operator++()
  {
    assert(!at_end());

    ssize_t i = _nranges - 1;
    while (i >= 0) {
      ++_its[i];
      if (_its[i] != _ends[i]) // range i not at end
        break;
      if (i > 0) // set range i to beginning if not done
        _its[i] = _begins[i];
      --i;
    }
    return *this;
  }